

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall nv::FloatImage::sampleLinearRepeat(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar1 = this->m_width;
  fVar12 = (float)uVar1;
  uVar2 = this->m_height;
  fVar6 = floorf(fVar12 * x);
  fVar13 = (float)uVar2;
  fVar6 = fVar12 * x - fVar6;
  fVar7 = floorf(fVar13 * y);
  fVar7 = fVar13 * y - fVar7;
  fVar8 = floorf(x);
  fVar8 = floorf((x - fVar8) * fVar12);
  fVar9 = floorf(y);
  fVar9 = floorf((y - fVar9) * fVar13);
  fVar10 = 1.0 / fVar12 + x;
  fVar11 = floorf(fVar10);
  fVar10 = floorf((fVar10 - fVar11) * fVar12);
  fVar11 = 1.0 / fVar13 + y;
  fVar12 = floorf(fVar11);
  fVar11 = floorf((fVar11 - fVar12) * fVar13);
  pfVar3 = this->m_mem;
  iVar4 = c * (uint)uVar2;
  iVar5 = ((int)fVar9 + iVar4) * (uint)uVar1;
  iVar4 = (iVar4 + (int)fVar11) * (uint)uVar1;
  return ((1.0 - fVar6) * pfVar3[(uint)((int)fVar8 + iVar4)] +
         fVar6 * pfVar3[(uint)(iVar4 + (int)fVar10)]) * fVar7 +
         (1.0 - fVar7) *
         (pfVar3[(uint)((int)fVar8 + iVar5)] * (1.0 - fVar6) +
         pfVar3[(uint)(iVar5 + (int)fVar10)] * fVar6);
}

Assistant:

float FloatImage::sampleLinearRepeat(float x, float y, int c) const
{
	const int w = m_width;
	const int h = m_height;
	
	const float fracX = frac(x * w);
	const float fracY = frac(y * h);
	
	int ix0 = ifloor(frac(x) * w);
	int iy0 = ifloor(frac(y) * h);
	int ix1 = ifloor(frac(x + 1.0f/w) * w);
	int iy1 = ifloor(frac(y + 1.0f/h) * h);
	
	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}